

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int xpathCommonTest(char *filename,char *result,int xptr,int expr)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  undefined8 local_13c0;
  char expression [5000];
  
  __filename = resultFilename(filename,temp_directory,".res");
  if (__filename == (char *)0x0) {
    fwrite("Out of memory\n",0xe,1,_stderr);
    fatalError();
  }
  xpathOutput = (FILE *)fopen64(__filename,"wb");
  if ((FILE *)xpathOutput == (FILE *)0x0) {
    pcVar2 = "failed to open output file %s\n";
    filename = __filename;
  }
  else {
    __stream = fopen64(filename,"rb");
    if (__stream != (FILE *)0x0) {
      local_13c0 = result;
LAB_0010d9e2:
      do {
        pcVar2 = fgets(expression,0x1194,__stream);
        if (pcVar2 == (char *)0x0) {
          fclose(__stream);
          fclose((FILE *)xpathOutput);
          pcVar2 = local_13c0;
          iVar5 = 0;
          if ((local_13c0 != (char *)0x0) &&
             (iVar1 = compareFiles(__filename,local_13c0), iVar1 != 0)) {
            fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar2);
            iVar5 = iVar1;
          }
          unlink(__filename);
          free(__filename);
          return iVar5;
        }
        sVar3 = strlen(expression);
        pcVar2 = expression + (int)sVar3;
        for (uVar4 = sVar3 & 0xffffffff; 0 < (int)(uint)uVar4; uVar4 = uVar4 - 1) {
          if ((0x20 < (ulong)(byte)expression[uVar4 - 1]) ||
             ((0x100002600U >> ((ulong)(byte)expression[uVar4 - 1] & 0x3f) & 1) == 0)) {
            expression[(uint)uVar4 & 0x7fffffff] = '\0';
            fprintf((FILE *)xpathOutput,"\n========================\nExpression: %s\n",expression);
            testXPath(expression,xptr,expr);
            goto LAB_0010d9e2;
          }
          pcVar2 = pcVar2 + -1;
        }
        *pcVar2 = '\0';
      } while( true );
    }
    pcVar2 = "Cannot open %s for reading\n";
  }
  fprintf(_stderr,pcVar2,filename);
  free(__filename);
  return -1;
}

Assistant:

static int
xpathCommonTest(const char *filename, const char *result,
                int xptr, int expr) {
    FILE *input;
    char expression[5000];
    int len, ret = 0;
    char *temp;

    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xpathOutput = fopen(temp, "wb");
    if (xpathOutput == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr,
		"Cannot open %s for reading\n", filename);
        free(temp);
	return(-1);
    }
    while (fgets(expression, 4500, input) != NULL) {
	len = strlen(expression);
	len--;
	while ((len >= 0) &&
	       ((expression[len] == '\n') || (expression[len] == '\t') ||
		(expression[len] == '\r') || (expression[len] == ' '))) len--;
	expression[len + 1] = 0;
	if (len >= 0) {
	    fprintf(xpathOutput,
	            "\n========================\nExpression: %s\n",
		    expression) ;
	    testXPath(expression, xptr, expr);
	}
    }

    fclose(input);
    fclose(xpathOutput);
    if (result != NULL) {
	ret = compareFiles(temp, result);
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	}
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(ret);
}